

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_544631::RSTFormatter::EndBlock(RSTFormatter *this)

{
  _Elt_pointer piVar1;
  
  piVar1 = (this->indents_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar1 == (this->indents_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar1 = (this->indents_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  this->indent_ = piVar1[-1];
  std::deque<int,_std::allocator<int>_>::pop_back(&(this->indents_).c);
  this->end_block_ = true;
  return;
}

Assistant:

void RSTFormatter::EndBlock() {
  indent_ = indents_.top();
  indents_.pop();
  end_block_ = true;
}